

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureLevelStateQueryTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureLevelCase::iterate(TextureLevelCase *this)

{
  GLuint *textures;
  ostringstream *this_00;
  byte bVar1;
  GLenum GVar2;
  TestLog *log;
  int iVar3;
  GLenum GVar4;
  undefined4 extraout_var;
  TextureFormat texFormat;
  TransferFormat TVar5;
  pointer piVar6;
  int ndx;
  long lVar7;
  GLenum GVar8;
  IterateResult IVar9;
  long lVar10;
  long lVar11;
  pointer pTVar12;
  allocator<char> local_301;
  GLuint *local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  ScopedLogSection section;
  int local_2b8;
  int local_2b4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  string local_250;
  string local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  MessageBuilder msg;
  
  pTVar12 = (this->m_iterations).
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec>_>
            ._M_impl.super__Vector_impl_data._M_start + this->m_iteration;
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>((string *)&msg,"Iteration",&local_301);
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  local_210._M_string_length = 0;
  local_210.field_2._M_local_buf[0] = '\0';
  std::operator+(&local_1f0,&local_210,"Iteration ");
  local_2b4 = this->m_iteration + 1;
  de::toString<int>(&local_230,&local_2b4);
  std::operator+(&local_1d0,&local_1f0,&local_230);
  std::operator+(&local_2b0,&local_1d0,"/");
  local_2b8 = (int)(((long)(this->m_iterations).
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->m_iterations).
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x58);
  de::toString<int>(&local_250,&local_2b8);
  std::operator+(&local_2f8,&local_2b0,&local_250);
  std::operator+(&local_290,&local_2f8," - ");
  std::operator+(&local_270,&local_290,&pTVar12->description);
  tcu::ScopedLogSection::ScopedLogSection(&section,log,(string *)&msg,&local_270);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&msg);
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            ((CallLogWrapper *)&local_2f8,(Functions *)CONCAT44(extraout_var,iVar3),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  local_2f8.field_2._M_local_buf[0] = '\x01';
  textures = &this->m_texture;
  glu::CallLogWrapper::glGenTextures((CallLogWrapper *)&local_2f8,1,textures);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)&local_2f8,pTVar12->bindTarget,*textures);
  GVar4 = glu::CallLogWrapper::glGetError((CallLogWrapper *)&local_2f8);
  glu::checkError(GVar4,"gen tex",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureLevelStateQueryTests.cpp"
                  ,0x3bd);
  local_300 = &this->m_texBuffer;
  lVar7 = 0;
  lVar11 = 0;
  do {
    lVar10 = *(long *)&(pTVar12->levels).
                       super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
                       ._M_impl.super__Vector_impl_data;
    if ((int)(((long)(pTVar12->levels).
                     super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
                     ._M_impl.super__Vector_impl_data._M_finish - lVar10) / 0x18) <= lVar11) {
      iVar3 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
                        (this,&local_2f8,pTVar12);
      IVar9 = CONTINUE;
      glu::CallLogWrapper::glDeleteTextures((CallLogWrapper *)&local_2f8,1,textures);
      *textures = 0;
      if (*local_300 != 0) {
        glu::CallLogWrapper::glDeleteBuffers((CallLogWrapper *)&local_2f8,1,local_300);
        *textures = 0;
      }
      glu::CallLogWrapper::~CallLogWrapper((CallLogWrapper *)&local_2f8);
      tcu::ScopedLogSection::~ScopedLogSection(&section);
      if ((char)iVar3 == '\0') {
        std::vector<int,_std::allocator<int>_>::push_back
                  (&this->m_failedIterations,&this->m_iteration);
        this->m_allIterationsOk = false;
      }
      iVar3 = this->m_iteration + 1;
      this->m_iteration = iVar3;
      if ((int)(((long)(this->m_iterations).
                       super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->m_iterations).
                      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x58) <= iVar3) {
        if (this->m_allIterationsOk == true) {
          IVar9 = STOP;
          tcu::TestContext::setTestResult
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_PASS,"Pass");
        }
        else {
          msg.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          this_00 = &msg.m_str;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
          std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,
                          "Following iteration(s) failed: ");
          for (lVar7 = 0;
              piVar6 = (this->m_failedIterations).super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_start,
              lVar7 < (int)((ulong)((long)(this->m_failedIterations).
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_finish - (long)piVar6) >> 2);
              lVar7 = lVar7 + 1) {
            if (lVar7 != 0) {
              std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,", ");
              piVar6 = (this->m_failedIterations).super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_start;
            }
            std::ostream::operator<<(this_00,piVar6[lVar7] + 1);
          }
          tcu::MessageBuilder::operator<<(&msg,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::TestContext::setTestResult
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_FAIL,"One or more iterations failed");
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
          IVar9 = STOP;
        }
      }
      return IVar9;
    }
    bVar1 = *(byte *)(lVar10 + 0x14 + lVar7);
    GVar4 = 0;
    if (bVar1 == 0) {
      texFormat = glu::mapGLInternalFormat(*(deUint32 *)(lVar10 + 0x10 + lVar7));
      TVar5 = glu::getTransferFormat(texFormat);
      GVar4 = TVar5.dataType;
      lVar10 = *(long *)&(pTVar12->levels).
                         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
                         ._M_impl.super__Vector_impl_data;
      bVar1 = *(byte *)(lVar10 + 0x14 + lVar7);
    }
    else {
      TVar5.format = 0;
      TVar5.dataType = 0;
    }
    GVar2 = pTVar12->bindTarget;
    if (pTVar12->immutable == true) {
      GVar4 = 0xde1;
      if (GVar2 == 0xde1 && (bVar1 & 1) == 0) {
LAB_012972b5:
        glu::CallLogWrapper::glTexStorage2D
                  ((CallLogWrapper *)&local_2f8,GVar4,1,*(GLenum *)(lVar10 + 0x10 + lVar7),
                   *(GLsizei *)(lVar10 + lVar7),*(GLsizei *)(lVar10 + 4 + lVar7));
      }
      else if ((((bVar1 & 1) == 0) && (GVar4 = 0x806f, GVar2 == 0x806f)) ||
              (((bVar1 & 1) == 0 && (GVar4 = 0x8c1a, GVar2 == 0x8c1a)))) {
LAB_0129720f:
        glu::CallLogWrapper::glTexStorage3D
                  ((CallLogWrapper *)&local_2f8,GVar4,1,*(GLenum *)(lVar10 + 0x10 + lVar7),
                   *(GLsizei *)(lVar10 + lVar7),*(GLsizei *)(lVar10 + 4 + lVar7),
                   *(GLsizei *)(lVar10 + 8 + lVar7));
      }
      else {
        if (((bVar1 & 1) == 0) && (GVar4 = 0x8513, GVar2 == 0x8513)) goto LAB_012972b5;
        if (((bVar1 & 1) == 0) && (GVar2 == 0x9100)) {
          glu::CallLogWrapper::glTexStorage2DMultisample
                    ((CallLogWrapper *)&local_2f8,0x9100,pTVar12->sampleCount,
                     *(GLenum *)(lVar10 + 0x10 + lVar7),*(GLsizei *)(lVar10 + lVar7),
                     *(GLsizei *)(lVar10 + 4 + lVar7),pTVar12->fixedSamplePos);
        }
        else if (((bVar1 & 1) == 0) && (GVar2 == 0x9102)) {
          glu::CallLogWrapper::glTexStorage3DMultisample
                    ((CallLogWrapper *)&local_2f8,0x9102,pTVar12->sampleCount,
                     *(GLenum *)(lVar10 + 0x10 + lVar7),*(GLsizei *)(lVar10 + lVar7),
                     *(GLsizei *)(lVar10 + 4 + lVar7),*(GLsizei *)(lVar10 + 8 + lVar7),
                     pTVar12->fixedSamplePos);
        }
        else {
          if (((bVar1 & 1) == 0) && (GVar4 = 0x9009, GVar2 == 0x9009)) goto LAB_0129720f;
          if (((bVar1 & 1) == 0) && (GVar2 == 0x8c2a)) {
            glu::CallLogWrapper::glGenBuffers((CallLogWrapper *)&local_2f8,1,local_300);
            glu::CallLogWrapper::glBindBuffer((CallLogWrapper *)&local_2f8,0x8c2a,*local_300);
            if (pTVar12->bindWholeArray == true) {
              glu::CallLogWrapper::glBufferData
                        ((CallLogWrapper *)&local_2f8,0x8c2a,(long)pTVar12->texBufferDataSize,
                         (void *)0x0,0x88e4);
              glu::CallLogWrapper::glTexBuffer
                        ((CallLogWrapper *)&local_2f8,0x8c2a,
                         *(GLenum *)
                          (*(long *)&(pTVar12->levels).
                                     super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
                                     ._M_impl.super__Vector_impl_data + 0x10 + lVar7),*local_300);
            }
            else {
              glu::CallLogWrapper::glBufferData
                        ((CallLogWrapper *)&local_2f8,0x8c2a,
                         (long)(pTVar12->texBufferDataSize + pTVar12->texBufferDataOffset),
                         (void *)0x0,0x88e4);
              glu::CallLogWrapper::glTexBufferRange
                        ((CallLogWrapper *)&local_2f8,0x8c2a,
                         *(GLenum *)
                          (*(long *)&(pTVar12->levels).
                                     super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
                                     ._M_impl.super__Vector_impl_data + 0x10 + lVar7),*local_300,
                         (long)pTVar12->texBufferDataOffset,(long)pTVar12->texBufferDataSize);
            }
          }
        }
      }
    }
    else {
      GVar8 = 0xde1;
      if (GVar2 == 0xde1 && (bVar1 & 1) == 0) {
LAB_012972e8:
        glu::CallLogWrapper::glTexImage2D
                  ((CallLogWrapper *)&local_2f8,GVar8,*(GLint *)(lVar10 + 0xc + lVar7),
                   *(GLint *)(lVar10 + 0x10 + lVar7),*(GLsizei *)(lVar10 + lVar7),
                   *(GLsizei *)(lVar10 + 4 + lVar7),0,TVar5.format,GVar4,(void *)0x0);
      }
      else {
        if ((((bVar1 & 1) != 0) || (GVar8 = 0x806f, GVar2 != 0x806f)) &&
           (((bVar1 & 1) != 0 || (GVar8 = 0x8c1a, GVar2 != 0x8c1a)))) {
          if (((bVar1 & 1) == 0) && (GVar2 == 0x8513)) {
            GVar8 = pTVar12->queryTarget;
            goto LAB_012972e8;
          }
          if (((bVar1 & 1) != 0) || (GVar8 = 0x9009, GVar2 != 0x9009)) {
            if (((bVar1 & 1) == 0) || (GVar2 != 0xde1)) {
              if (((bVar1 & 1) != 0) && (GVar2 == 0x8c1a)) {
                glu::CallLogWrapper::glCompressedTexImage3D
                          ((CallLogWrapper *)&local_2f8,0x8c1a,*(GLint *)(lVar10 + 0xc + lVar7),
                           *(GLenum *)(lVar10 + 0x10 + lVar7),*(GLsizei *)(lVar10 + lVar7),
                           *(GLsizei *)(lVar10 + 4 + lVar7),*(GLsizei *)(lVar10 + 8 + lVar7),0,0x400
                           ,Functional::(anonymous_namespace)::
                            applyTextureGenerationSpec(glu::CallLogWrapper&,deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec_const&,unsigned_int&)
                            ::buffer);
              }
            }
            else {
              glu::CallLogWrapper::glCompressedTexImage2D
                        ((CallLogWrapper *)&local_2f8,0xde1,*(GLint *)(lVar10 + 0xc + lVar7),
                         *(GLenum *)(lVar10 + 0x10 + lVar7),*(GLsizei *)(lVar10 + lVar7),
                         *(GLsizei *)(lVar10 + 4 + lVar7),0,0x200,
                         Functional::(anonymous_namespace)::
                         applyTextureGenerationSpec(glu::CallLogWrapper&,deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec_const&,unsigned_int&)
                         ::buffer);
            }
            goto LAB_0129730c;
          }
        }
        glu::CallLogWrapper::glTexImage3D
                  ((CallLogWrapper *)&local_2f8,GVar8,*(GLint *)(lVar10 + 0xc + lVar7),
                   *(GLint *)(lVar10 + 0x10 + lVar7),*(GLsizei *)(lVar10 + lVar7),
                   *(GLsizei *)(lVar10 + 4 + lVar7),*(GLsizei *)(lVar10 + 8 + lVar7),0,TVar5.format,
                   GVar4,(void *)0x0);
      }
    }
LAB_0129730c:
    GVar4 = glu::CallLogWrapper::glGetError((CallLogWrapper *)&local_2f8);
    if (GVar4 != 0) {
      msg.m_log = (TestLog *)local_2f8._M_string_length;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg.m_str);
      local_2b0._M_dataplus._M_p = (pointer)glu::getErrorName;
      local_2b0._M_string_length._0_4_ = GVar4;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_290,&local_2b0);
      std::operator+(&local_270,"Texture specification failed, got ",&local_290);
      std::operator<<(&msg.m_str.super_basic_ostream<char,_std::char_traits<char>_>,
                      (string *)&local_270);
      tcu::MessageBuilder::operator<<(&msg,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::~string((string *)&local_290);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msg.m_str);
    }
    lVar11 = lVar11 + 1;
    lVar7 = lVar7 + 0x18;
  } while( true );
}

Assistant:

TextureLevelCase::IterateResult TextureLevelCase::iterate (void)
{
	const bool result = testConfig(m_iterations[m_iteration]);

	if (!result)
	{
		m_failedIterations.push_back(m_iteration);
		m_allIterationsOk = false;
	}

	if (++m_iteration < (int)m_iterations.size())
		return CONTINUE;

	if (m_allIterationsOk)
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
	{
		tcu::MessageBuilder msg(&m_testCtx.getLog());

		msg << "Following iteration(s) failed: ";
		for (int ndx = 0; ndx < (int)m_failedIterations.size(); ++ndx)
		{
			if (ndx)
				msg << ", ";
			msg << (m_failedIterations[ndx] + 1);
		}
		msg << tcu::TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "One or more iterations failed");
	}
	return STOP;
}